

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnReader::PrepareRead
          (ColumnReader *this,optional_ptr<const_duckdb::TableFilter,_true> filter,
          optional_ptr<duckdb::TableFilterState,_true> filter_state)

{
  ReadAheadBuffer *this_00;
  _Head_base<0UL,_duckdb::RleBpDecoder_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ThriftFileTransport *this_01;
  bool bVar3;
  runtime_error *prVar4;
  uint64_t len;
  PageHeader page_hdr;
  PageHeader local_200;
  
  this->encoding = INVALID;
  _Var1._M_head_impl =
       (this->defined_decoder).
       super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
       super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl;
  (this->defined_decoder).
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = (RleBpDecoder *)0x0;
  if (_Var1._M_head_impl != (RleBpDecoder *)0x0) {
    operator_delete(_Var1._M_head_impl);
  }
  this->page_is_filtered_out = false;
  p_Var2 = (this->block).internal.
           super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->block).internal.super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->block).internal.super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  duckdb_parquet::PageHeader::PageHeader(&local_200);
  this_01 = (ThriftFileTransport *)
            (this->protocol->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var2 = (this->protocol->ptrans_).
           super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  this_00 = &this_01->ra_buffer;
  if (((ReadAheadBuffer *)
       (this_01->ra_buffer).read_heads.
       super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
       super__List_node_base._M_next == this_00) &&
     ((this_01->ra_buffer).merge_set._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    len = this_01->size - this_01->location;
    if (0xff < len) {
      len = 0x100;
    }
    ThriftFileTransport::Prefetch(this_01,this_01->location,len);
    ParquetReader::Read(this->reader,
                        (TBase *)(&local_200.field_0x0 + *(long *)(local_200._0_8_ + -0x30)),
                        this->protocol);
    ::std::__cxx11::_List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>::_M_clear
              ((_List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_> *)this_00);
    (this_01->ra_buffer).read_heads.
    super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this_01->ra_buffer).read_heads.
    super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)this_00;
    (this_01->ra_buffer).read_heads.
    super__List_base<duckdb::ReadHead,_std::allocator<duckdb::ReadHead>_>._M_impl._M_node._M_size =
         0;
    ::std::
    _Rb_tree<duckdb::ReadHead_*,_duckdb::ReadHead_*,_std::_Identity<duckdb::ReadHead_*>,_duckdb::ReadHeadComparator,_std::allocator<duckdb::ReadHead_*>_>
    ::clear(&(this_01->ra_buffer).merge_set._M_t);
  }
  else {
    ParquetReader::Read(this->reader,
                        (TBase *)(&local_200.field_0x0 + *(long *)(local_200._0_8_ + -0x30)),
                        this->protocol);
  }
  if ((local_200.compressed_page_size < 0) || (local_200.uncompressed_page_size < 0)) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar4,"Page sizes can\'t be < 0");
    __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar3 = PageIsFilteredOut(this,&local_200);
  if (bVar3) goto LAB_01cb8653;
  if (local_200.type == DATA_PAGE) {
    PreparePage(this,&local_200);
LAB_01cb863a:
    PrepareDataPage(this,&local_200);
  }
  else if (local_200.type == DICTIONARY_PAGE) {
    PreparePage(this,&local_200);
    if ((long)local_200.dictionary_page_header.num_values < 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar4,"Invalid dictionary page header (num_values < 0)");
      __cxa_throw(prVar4,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    DictionaryDecoder::InitializeDictionary
              (&this->dictionary_decoder,(long)local_200.dictionary_page_header.num_values,filter,
               filter_state,this->column_schema->max_define != 0);
  }
  else if (local_200.type == DATA_PAGE_V2) {
    PreparePageV2(this,&local_200);
    goto LAB_01cb863a;
  }
  (*this->_vptr_ColumnReader[0x12])(this);
LAB_01cb8653:
  duckdb_parquet::PageHeader::~PageHeader(&local_200);
  return;
}

Assistant:

void ColumnReader::PrepareRead(optional_ptr<const TableFilter> filter, optional_ptr<TableFilterState> filter_state) {
	encoding = ColumnEncoding::INVALID;
	defined_decoder.reset();
	page_is_filtered_out = false;
	block.reset();
	PageHeader page_hdr;
	auto &trans = reinterpret_cast<ThriftFileTransport &>(*protocol->getTransport());
	if (trans.HasPrefetch()) {
		// Already has some data prefetched, let's not mess with it
		reader.Read(page_hdr, *protocol);
	} else {
		// No prefetch yet, prefetch the full header in one go (so thrift won't read byte-by-byte from storage)
		// 256 bytes should cover almost all headers (unless it's a V2 header with really LONG string statistics)
		static constexpr idx_t ASSUMED_HEADER_SIZE = 256;
		const auto prefetch_size = MinValue(trans.GetSize() - trans.GetLocation(), ASSUMED_HEADER_SIZE);
		trans.Prefetch(trans.GetLocation(), prefetch_size);
		reader.Read(page_hdr, *protocol);
		trans.ClearPrefetch();
	}
	// some basic sanity check
	if (page_hdr.compressed_page_size < 0 || page_hdr.uncompressed_page_size < 0) {
		throw std::runtime_error("Page sizes can't be < 0");
	}

	if (PageIsFilteredOut(page_hdr)) {
		// this page has been filtered out so we don't need to read it
		return;
	}

	switch (page_hdr.type) {
	case PageType::DATA_PAGE_V2:
		PreparePageV2(page_hdr);
		PrepareDataPage(page_hdr);
		break;
	case PageType::DATA_PAGE:
		PreparePage(page_hdr);
		PrepareDataPage(page_hdr);
		break;
	case PageType::DICTIONARY_PAGE: {
		PreparePage(page_hdr);
		auto dictionary_size = page_hdr.dictionary_page_header.num_values;
		if (dictionary_size < 0) {
			throw std::runtime_error("Invalid dictionary page header (num_values < 0)");
		}
		dictionary_decoder.InitializeDictionary(dictionary_size, filter, filter_state, HasDefines());
		break;
	}
	default:
		break; // ignore INDEX page type and any other custom extensions
	}
	ResetPage();
}